

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Texture::Storage
               (Functions *gl,GLenum target,GLsizei levels,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth)

{
  GLenum GVar1;
  TestError *this;
  GLuint height_local;
  GLuint width_local;
  GLenum internal_format_local;
  GLsizei levels_local;
  GLenum target_local;
  Functions *gl_local;
  
  if (target == 0xde0) {
    (*gl->texStorage1D)(0xde0,levels,internal_format,width);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,"TexStorage1D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x35a);
    return;
  }
  if (target == 0xde1) {
LAB_0169f558:
    (*gl->texStorage2D)(target,levels,internal_format,width,height);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,"TexStorage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x361);
  }
  else {
    if (target != 0x806f) {
      if (((target == 0x84f5) || (target == 0x8513)) || (target == 0x8c18)) goto LAB_0169f558;
      if (target != 0x8c1a) {
        if (target == 0x9100) {
          (*gl->texStorage2DMultisample)(0x9100,levels,internal_format,width,height,'\0');
          GVar1 = (*gl->getError)();
          glu::checkError(GVar1,"TexStorage2DMultisample",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x365);
          return;
        }
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invliad enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   ,0x36d);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    (*gl->texStorage3D)(target,levels,internal_format,width,height,depth);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,"TexStorage3D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x36a);
  }
  return;
}

Assistant:

void Texture::Storage(const glw::Functions& gl, glw::GLenum target, glw::GLsizei levels, glw::GLenum internal_format,
					  glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_CUBE_MAP:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.texStorage2DMultisample(target, levels, internal_format, width, height, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2DMultisample");
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}